

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *validation_options,string *out_error)

{
  bool bVar1;
  uint uVar2;
  pointer pcVar3;
  FileDescriptor *pFVar4;
  _Alloc_hider _Var5;
  slot_type *psVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  anon_union_8_1_a8a14541_for_iterator_2 aVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  pointer prVar15;
  ostream *poVar16;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar17;
  anon_union_8_1_a8a14541_for_iterator_2 aVar18;
  size_type sVar19;
  anon_union_8_1_a8a14541_for_iterator_2 in_R8;
  pointer ppFVar20;
  Options *pOVar21;
  string_view path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  string other_package_for_prefix;
  size_type __dnew;
  const_iterator i;
  string lookup_key;
  const_iterator package_match;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  anon_union_8_1_a8a14541_for_iterator_2 local_1d0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1c8;
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [16];
  undefined1 local_198 [40];
  undefined1 local_170 [24];
  undefined1 local_158 [48];
  char *local_128;
  undefined8 local_120;
  AlphaNum *local_118;
  undefined8 local_110;
  char *local_108;
  anon_union_8_1_a8a14541_for_iterator_2 local_100;
  anon_union_8_1_a8a14541_for_iterator_2 local_f8;
  undefined8 local_f0;
  char *local_e8;
  AlphaNum *local_e0;
  AlphaNum *local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0 [32];
  AlphaNum local_a0;
  Options *local_70;
  iterator local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  pointer local_38;
  
  iVar11 = std::__cxx11::string::compare((char *)validation_options);
  if (iVar11 == 0) {
    return true;
  }
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  sVar19 = (validation_options->expected_prefixes_path)._M_string_length;
  local_70 = validation_options;
  if (sVar19 != 0) {
    pcVar3 = (validation_options->expected_prefixes_path)._M_dataplus._M_p;
    local_170._8_8_ = (slot_type *)local_158;
    local_170._0_8_ = &PTR__PackageToPrefixesCollector_008481d8;
    local_1a8._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0x11;
    aVar13.slot_ = (slot_type *)
                   std::__cxx11::string::_M_create((ulong *)(local_170 + 8),(ulong)local_1a8);
    local_158._0_8_ = local_1a8._0_8_;
    *(undefined8 *)aVar13.slot_ = 0x6465746365707845;
    builtin_strncpy((char *)((long)aVar13.slot_ + 8)," prefixe",8);
    *(char *)((long)aVar13.slot_ + 0x10) = 's';
    local_170._16_8_ = local_1a8._0_8_;
    *(char *)((long)aVar13.slot_ + local_1a8._0_8_) = '\0';
    local_158._16_8_ = &local_58;
    path._M_str = pcVar3;
    path._M_len = sVar19;
    local_170._8_8_ = aVar13.slot_;
    bVar8 = ParseSimpleFile(path,(LineConsumer *)local_170,out_error);
    local_170._0_8_ = &PTR__PackageToPrefixesCollector_008481d8;
    if ((slot_type *)local_170._8_8_ != (slot_type *)local_158) {
      operator_delete((void *)local_170._8_8_,(ulong)(local_158._0_8_ + 1));
    }
    if (!bVar8) {
      bVar8 = false;
      goto LAB_001d28c4;
    }
  }
  ppFVar20 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = ppFVar20 == local_38;
  pOVar21 = local_70;
  while (!bVar8) {
    pFVar4 = *ppFVar20;
    local_170._8_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)->slot_;
    local_170._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)[1].slot_;
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                       ((pOVar21->expected_prefixes_suppressions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pOVar21->expected_prefixes_suppressions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,local_170);
    iVar11 = 3;
    if (_Var14._M_current ==
        (pOVar21->expected_prefixes_suppressions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_198._32_8_ = (pOVar21->expected_prefixes_path)._M_dataplus._M_p;
      local_1c0._16_8_ = (pOVar21->expected_prefixes_path)._M_string_length;
      bVar1 = pOVar21->prefixes_must_be_registered;
      bVar10 = pOVar21->require_prefixes;
      uVar2 = *(uint *)((long)&pFVar4->options_->field_0 + 0x18);
      paVar17 = (anon_union_8_1_a8a14541_for_iterator_2 *)
                ((ulong)(pFVar4->options_->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ &
                0xfffffffffffffffc);
      aVar13 = (anon_union_8_1_a8a14541_for_iterator_2)paVar17->slot_;
      aVar18 = (anon_union_8_1_a8a14541_for_iterator_2)paVar17[1].slot_;
      _Var5._M_p = (pFVar4->package_->_M_dataplus)._M_p;
      sVar19 = pFVar4->package_->_M_string_length;
      if (sVar19 == 0) {
        local_170._8_8_ = "no_package:";
        local_170._0_8_ = (ctrl_t *)0xb;
        local_1a8._8_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)->slot_;
        local_1a8._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)[1];
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_c0,(lts_20250127 *)local_170,(AlphaNum *)local_1a8,
                   (AlphaNum *)local_1a8._8_8_);
      }
      else {
        local_c0._0_8_ = local_c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c0,_Var5._M_p,_Var5._M_p + sVar19);
      }
      local_68 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::find<std::__cxx11::string>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)&local_58,(key_arg<std::__cxx11::basic_string<char>_> *)local_c0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::AssertNotDebugCapacity(&local_58);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_170._8_8_;
      local_170._0_16_ = auVar7 << 0x40;
      bVar9 = absl::lts_20250127::container_internal::operator==(&local_68,(iterator *)local_170);
      if (bVar9) {
        if ((uVar2 & 8) == 0) {
          iVar11 = 0;
          if (bVar10 != false) {
            local_170._8_8_ = "error: \'";
            local_170._0_8_ = &DAT_00000008;
            local_1a8._8_8_ = *(anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_;
            local_1a8._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)[1];
            local_a0.piece_._M_len = 0x36;
            local_a0.piece_._M_str = "\' does not have a required \'option objc_class_prefix\'.";
            absl::lts_20250127::StrCat_abi_cxx11_
                      ((string *)&local_1d0,(lts_20250127 *)local_170,(AlphaNum *)local_1a8,
                       &local_a0,(AlphaNum *)in_R8.slot_);
            std::__cxx11::string::operator=((string *)out_error,(string *)&local_1d0);
LAB_001d2338:
            aVar13 = in_R8;
            if (local_1d0.slot_ != (slot_type *)local_1c0) {
              sVar19 = CONCAT71(local_1c0._1_7_,local_1c0[0]);
              aVar18 = local_1d0;
LAB_001d2699:
              operator_delete(aVar18.slot_,sVar19 + 1);
            }
            goto LAB_001d26a1;
          }
        }
        else {
          if (((AlphaNum *)local_1c0._16_8_ != (AlphaNum *)0x0) &&
             (aVar18.slot_ != (slot_type *)0x0)) {
            local_1d0.slot_ = (slot_type *)local_1c0;
            local_1c8.slot_ = (slot_type *)0x0;
            local_1c0[0] = 0;
            local_170._0_16_ =
                 (undefined1  [16])
                 absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(&local_58);
            while( true ) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::AssertNotDebugCapacity(&local_58);
              local_1a8._0_8_ = (slot_type *)0x0;
              bVar10 = absl::lts_20250127::container_internal::operator==
                                 ((iterator *)local_170,(iterator *)local_1a8);
              if (bVar10) break;
              prVar15 = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::iterator::operator->((iterator *)local_170);
              psVar6 = (slot_type *)(prVar15->second)._M_string_length;
              if ((psVar6 == aVar18.slot_) &&
                 ((psVar6 == (slot_type *)0x0 ||
                  (iVar11 = bcmp((prVar15->second)._M_dataplus._M_p,aVar13.slot_,(size_t)psVar6),
                  iVar11 == 0)))) {
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::iterator::operator->((iterator *)local_170);
                std::__cxx11::string::_M_assign((string *)&local_1d0);
                if ((local_1c8.slot_ < (slot_type *)0xb) ||
                   (*(long *)((long)local_1d0.slot_ + 3) != 0x3a6567616b636170 ||
                    *(long *)local_1d0.slot_ != 0x616b6361705f6f6e)) break;
              }
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::iterator::operator++((iterator *)local_170);
            }
            if (local_1c8.slot_ != (slot_type *)0x0) {
              local_158._32_8_ = (pFVar4->name_->_M_dataplus)._M_p;
              local_158._24_8_ = pFVar4->name_->_M_string_length;
              local_170._0_8_ = (_func_int **)0x2a;
              local_170._8_8_ = "error: Found \'option objc_class_prefix = \"";
              local_158._8_8_ = 8;
              local_158._16_8_ = "\";\' in \'";
              local_158._40_8_ = 0x23;
              local_128 = "\'; that prefix is already used for ";
              pieces._M_len = local_158._32_8_;
              pieces._M_array = (iterator)&DAT_00000005;
              local_170._16_8_ = aVar18;
              local_158._0_8_ = aVar13;
              absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                        ((string *)local_1a8,(strings_internal *)local_170,pieces);
              std::__cxx11::string::operator=((string *)out_error,(string *)local_1a8);
              if ((slot_type *)local_1a8._0_8_ != (slot_type *)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
              }
              if ((local_1c8.slot_ < (slot_type *)0xb) ||
                 (*(long *)((long)local_1d0.slot_ + 3) != 0x3a6567616b636170 ||
                  *(long *)local_1d0.slot_ != 0x616b6361705f6f6e)) {
                local_170._0_8_ = (_func_int **)0x9;
                local_170._8_8_ = "\'package ";
                local_1a8._0_8_ = local_1c8;
                local_1a8._8_8_ = local_1d0;
                local_a0.piece_._M_len = 3;
                local_a0.piece_._M_str = ";\'.";
                absl::lts_20250127::StrAppend
                          (out_error,(AlphaNum *)local_170,(AlphaNum *)local_1a8,&local_a0);
              }
              else {
                local_170._0_8_ = &DAT_00000006;
                local_170._8_8_ = "file \'";
                in_R8.slot_ = (slot_type *)((long)local_1d0.slot_ + 0xb);
                local_1a8._0_8_ = (slot_type *)((long)local_1c8.slot_ + -0xb);
                if (*(long *)((long)local_1d0.slot_ + 3) != 0x3a6567616b636170 ||
                    *(long *)local_1d0.slot_ != 0x616b6361705f6f6e) {
                  in_R8 = local_1d0;
                  local_1a8._0_8_ = local_1c8;
                }
                local_a0.piece_._M_len = 2;
                local_a0.piece_._M_str = "\'.";
                local_1a8._8_8_ = in_R8;
                absl::lts_20250127::StrAppend
                          (out_error,(AlphaNum *)local_170,(AlphaNum *)local_1a8,&local_a0);
              }
              local_170._8_8_ = " It can only be reused by adding \'";
              local_170._0_8_ = (ctrl_t *)0x22;
              local_170._16_8_ = local_c0._8_8_;
              local_158._0_8_ = local_c0._0_8_;
              local_158._8_8_ = 3;
              local_158._16_8_ =
                   (long)
                   "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n    = "
                   + 0x4e;
              local_158._40_8_ = 0x21;
              local_128 = "\' to the expected prefixes file (";
              local_120 = local_1c0._16_8_;
              local_118 = (AlphaNum *)local_198._32_8_;
              local_110 = 2;
              local_108 = ").";
              pieces_00._M_len = local_c0._8_8_;
              pieces_00._M_array = (iterator)0x7;
              local_158._24_8_ = aVar18;
              local_158._32_8_ = aVar13;
              absl::lts_20250127::strings_internal::AppendPieces
                        ((strings_internal *)out_error,(Nonnull<std::string_*>)local_170,pieces_00);
              goto LAB_001d2338;
            }
            if (local_1d0.slot_ != (slot_type *)local_1c0) {
              operator_delete(local_1d0.slot_,CONCAT71(local_1c0._1_7_,local_1c0[0]) + 1);
            }
          }
          if (aVar18.slot_ != (slot_type *)0x0) {
            if (0x19 < (byte)(*(char *)aVar13.slot_ + 0xbfU)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)aVar13.slot_,(long)aVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\";\' in \'",8);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(pFVar4->name_->_M_dataplus)._M_p,
                                   pFVar4->name_->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\';",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16," it should start with a capital letter.",0x27);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
              std::ostream::put((char)poVar16);
              std::ostream::flush();
              std::ostream::flush();
            }
            if (aVar18.slot_ < (slot_type *)0x3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)aVar13.slot_,(long)aVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\";\' in \'",8);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(pFVar4->name_->_M_dataplus)._M_p,
                                   pFVar4->name_->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\';",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16," Apple recommends they should be at least 3 characters long.",0x3c
                        );
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
              std::ostream::put((char)poVar16);
              std::ostream::flush();
              std::ostream::flush();
            }
          }
          iVar11 = 0;
          if ((AlphaNum *)local_1c0._16_8_ != (AlphaNum *)0x0) {
            if (bVar1 != false) {
              local_158._0_8_ = (pFVar4->name_->_M_dataplus)._M_p;
              local_170._16_8_ = pFVar4->name_->_M_string_length;
              local_f8 = aVar13;
              if (aVar18.slot_ == (slot_type *)0x0) {
                local_f8.slot_ = (slot_type *)0x518206;
              }
              local_170._8_8_ = "error: \'";
              local_170._0_8_ = &DAT_00000008;
              local_158._8_8_ = 0x23;
              local_158._16_8_ = "\' has \'option objc_class_prefix = \"";
              local_100 = aVar18;
              if (aVar18.slot_ == (slot_type *)0x0) {
                local_100 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
              }
              local_158._40_8_ = 0x24;
              local_128 = "\";\', but it is not registered. Add \'";
              local_120 = local_c0._8_8_;
              local_118 = (AlphaNum *)local_c0._0_8_;
              local_110 = 3;
              local_108 = " = ";
              local_f0 = 0x21;
              local_e8 = "\' to the expected prefixes file (";
              local_e0 = (AlphaNum *)local_1c0._16_8_;
              local_d8 = (AlphaNum *)local_198._32_8_;
              local_d0 = 2;
              local_c8 = ").";
              pieces_01._M_len = local_c0._8_8_;
              pieces_01._M_array = (iterator)0xb;
              local_158._24_8_ = aVar18;
              local_158._32_8_ = aVar13;
              absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                        ((string *)local_1a8,(strings_internal *)local_170,pieces_01);
              std::__cxx11::string::operator=((string *)out_error,(string *)local_1a8);
              sVar19 = local_198._0_8_;
              aVar18 = (anon_union_8_1_a8a14541_for_iterator_2)local_1a8._0_8_;
              if ((slot_type *)local_1a8._0_8_ != (slot_type *)(local_1a8 + 0x10))
              goto LAB_001d2699;
              goto LAB_001d26a1;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "protoc:0: warning: Found unexpected \'option objc_class_prefix = \"",0x41);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)aVar13.slot_,(long)aVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\";\' in \'",8);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(pFVar4->name_->_M_dataplus)._M_p,
                                 pFVar4->name_->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"\'; consider adding \'",0x14);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(char *)local_c0._0_8_,local_c0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," = ",3);
            if (aVar18.slot_ == (slot_type *)0x0) {
              aVar13.slot_ = (slot_type *)0x518206;
              aVar18 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
            }
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(char *)aVar13.slot_,(long)aVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"\' to the expected prefixes file (",0x21);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(char *)local_198._32_8_,local_1c0._16_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
            std::ostream::put((char)poVar16);
            std::ostream::flush();
            std::ostream::flush();
            iVar11 = 0;
          }
        }
      }
      else {
        if ((uVar2 & 8) != 0) {
          prVar15 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::iterator::operator->(&local_68);
          psVar6 = (slot_type *)(prVar15->second)._M_string_length;
          if ((psVar6 == aVar18.slot_) &&
             ((iVar11 = 0, psVar6 == (slot_type *)0x0 ||
              (iVar12 = bcmp((prVar15->second)._M_dataplus._M_p,aVar13.slot_,(size_t)psVar6),
              iVar12 == 0)))) goto LAB_001d26a7;
        }
        local_170._0_8_ = (_func_int **)0x2d;
        local_170._8_8_ = "error: Expected \'option objc_class_prefix = \"";
        prVar15 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::iterator::operator->(&local_68);
        local_1a8._8_8_ = (prVar15->second)._M_dataplus._M_p;
        local_1a8._0_8_ = (prVar15->second)._M_string_length;
        local_a0.piece_._M_len = 3;
        local_a0.piece_._M_str = "\";\'";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_1d0,(lts_20250127 *)local_170,(AlphaNum *)local_1a8,&local_a0,
                   (AlphaNum *)in_R8.slot_);
        std::__cxx11::string::operator=((string *)out_error,(string *)&local_1d0);
        if (local_1d0.slot_ != (slot_type *)local_1c0) {
          operator_delete(local_1d0.slot_,CONCAT71(local_1c0._1_7_,local_1c0[0]) + 1);
        }
        if (sVar19 != 0) {
          local_170._0_8_ = (_func_int **)0xe;
          local_170._8_8_ = " for package \'";
          local_a0.piece_._M_len = 1;
          local_a0.piece_._M_str = "\'";
          local_1a8._0_8_ = sVar19;
          local_1a8._8_8_ = _Var5._M_p;
          absl::lts_20250127::StrAppend
                    (out_error,(AlphaNum *)local_170,(AlphaNum *)local_1a8,&local_a0);
        }
        local_170._0_8_ = &DAT_00000005;
        local_170._8_8_ = " in \'";
        local_1a8._8_8_ = *(anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_;
        local_1a8._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar4->name_)[1];
        local_a0.piece_._M_len = 1;
        local_a0.piece_._M_str = "\'";
        absl::lts_20250127::StrAppend
                  (out_error,(AlphaNum *)local_170,(AlphaNum *)local_1a8,&local_a0);
        if ((uVar2 & 8) != 0) {
          local_170._0_8_ = &DAT_0000000d;
          local_170._8_8_ = "; but found \'";
          local_a0.piece_._M_len = 9;
          local_a0.piece_._M_str = "\' instead";
          local_1a8._0_8_ = aVar18;
          local_1a8._8_8_ = aVar13;
          absl::lts_20250127::StrAppend
                    (out_error,(AlphaNum *)local_170,(AlphaNum *)local_1a8,&local_a0);
        }
        aVar13 = in_R8;
        local_170._8_8_ = (slot_type *)0x69501f;
        local_170._0_8_ = (ctrl_t *)0x1;
        absl::lts_20250127::StrAppend(out_error,(AlphaNum *)local_170);
LAB_001d26a1:
        in_R8 = aVar13;
        iVar11 = 1;
      }
LAB_001d26a7:
      pOVar21 = local_70;
      if ((AlphaNum *)local_c0._0_8_ != (AlphaNum *)(local_c0 + 0x10)) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        pOVar21 = local_70;
      }
    }
    if ((iVar11 != 3) && (iVar11 != 0)) break;
    ppFVar20 = ppFVar20 + 1;
    bVar8 = ppFVar20 == local_38;
  }
LAB_001d28c4:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_58);
  return bVar8;
}

Assistant:

bool ValidateObjCClassPrefixes(const std::vector<const FileDescriptor*>& files,
                               const Options& validation_options,
                               std::string* out_error) {
  // Allow a '-' as the path for the expected prefixes to completely disable
  // even the most basic of checks.
  if (validation_options.expected_prefixes_path == "-") {
    return true;
  }

  // Load the expected package prefixes, if available, to validate against.
  absl::flat_hash_map<std::string, std::string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(validation_options.expected_prefixes_path,
                                   &expected_package_prefixes, out_error)) {
    return false;
  }

  for (auto file : files) {
    bool should_skip =
        (std::find(validation_options.expected_prefixes_suppressions.begin(),
                   validation_options.expected_prefixes_suppressions.end(),
                   file->name()) !=
         validation_options.expected_prefixes_suppressions.end());
    if (should_skip) {
      continue;
    }

    bool is_valid =
        ValidateObjCClassPrefix(file, validation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                validation_options.prefixes_must_be_registered,
                                validation_options.require_prefixes, out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}